

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O3

handshake_fun_t
zmq::zmtp_engine_t::select_handshake_fun(bool unversioned_,uchar revision_,uchar minor_)

{
  code *pcVar1;
  undefined3 in_register_00000039;
  
  if (CONCAT31(in_register_00000039,unversioned_) == 0) {
    if (revision_ == '\0') {
      pcVar1 = handshake_v1_0;
    }
    else {
      if (revision_ == '\x03') {
        if (minor_ == '\0') {
          return 0x1f747c;
        }
      }
      else if (revision_ == '\x01') {
        return 0x1f73ae;
      }
      pcVar1 = handshake_v3_1;
    }
  }
  else {
    pcVar1 = handshake_v1_0_unversioned;
  }
  return (handshake_fun_t)pcVar1;
}

Assistant:

zmq::zmtp_engine_t::handshake_fun_t zmq::zmtp_engine_t::select_handshake_fun (
  bool unversioned_, unsigned char revision_, unsigned char minor_)
{
    //  Is the peer using ZMTP/1.0 with no revision number?
    if (unversioned_) {
        return &zmtp_engine_t::handshake_v1_0_unversioned;
    }
    switch (revision_) {
        case ZMTP_1_0:
            return &zmtp_engine_t::handshake_v1_0;
        case ZMTP_2_0:
            return &zmtp_engine_t::handshake_v2_0;
        case ZMTP_3_x:
            switch (minor_) {
                case 0:
                    return &zmtp_engine_t::handshake_v3_0;
                default:
                    return &zmtp_engine_t::handshake_v3_1;
            }
        default:
            return &zmtp_engine_t::handshake_v3_1;
    }
}